

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O0

callback_t *
end_class_state(callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  bool bVar1;
  QLoggingCategory *pQVar2;
  char *category;
  QDebug *debug;
  element_type *peVar3;
  QMessageLogger local_58;
  QDebug local_38 [15];
  bool local_29;
  int *piStack_28;
  bool qt_category_enabled;
  int *error_local;
  ifstream *f_local;
  MetaConfiguration *conf_local;
  
  piStack_28 = error;
  error_local = (int *)f;
  f_local = (ifstream *)conf;
  conf_local = (MetaConfiguration *)__return_storage_ptr__;
  std::istream::ignore();
  pQVar2 = parser();
  local_29 = QLoggingCategory::isDebugEnabled(pQVar2);
  while (local_29 != false) {
    pQVar2 = parser();
    category = QLoggingCategory::categoryName(pQVar2);
    QMessageLogger::QMessageLogger(&local_58,(char *)0x0,0,(char *)0x0,category);
    QMessageLogger::debug();
    debug = QDebug::operator<<(local_38,"finishing class ");
    peVar3 = std::__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        (anonymous_namespace)::current_class);
    operator<<(debug,&peVar3->name);
    QDebug::~QDebug(local_38);
    local_29 = false;
  }
  peVar3 = std::__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      (anonymous_namespace)::current_class);
  std::shared_ptr<MetaClass>::operator=
            ((shared_ptr<MetaClass> *)(anonymous_namespace)::current_class,&peVar3->parent);
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)(anonymous_namespace)::current_class);
  if (bVar1) {
    std::
    function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
    ::
    function<std::function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>(&)(MetaConfiguration&,std::ifstream&,int&),void>
              ((function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
                *)__return_storage_ptr__,class_state);
  }
  else {
    std::
    function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
    ::function(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

callback_t end_class_state(MetaConfiguration &conf, std::ifstream &f,
                           int &error) {
  f.ignore();
  qCDebug(parser) << "finishing class " << current_class->name;
  current_class = current_class->parent;

  if (current_class)
    return class_state;
  return nullptr;
}